

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::addNeighbor
          (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,int index)

{
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_28;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *newNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  int index_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_local;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  newNode._4_4_ = index;
  pbStack_18 = data;
  data_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::node
            (this_00);
  local_28 = this_00;
  std::__cxx11::string::string((string *)&local_58,(string *)data);
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::setData
            (this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add(this->adjacencyList + newNode._4_4_,local_28);
  return;
}

Assistant:

void Graph<T>::addNeighbor(T data, int index)
{
  node<T>* newNode = new node<T>();
  newNode -> setData(data);
  adjacencyList[index].add(newNode);
}